

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::createSlice
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,HighsInt from_col,HighsInt to_col)

{
  int iVar1;
  int *piVar2;
  HighsInt HVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  int iVar10;
  size_type __new_size;
  long lVar11;
  
  HVar3 = matrix->num_row_;
  iVar1 = to_col + 1;
  iVar10 = iVar1 - from_col;
  piVar5 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (long)piVar5[iVar1] - (long)piVar5[from_col];
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)(iVar10 + 1));
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,__new_size);
  piVar5 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = piVar5 + from_col;
  iVar4 = *piVar2;
  piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (from_col <= to_col) {
    lVar11 = 0;
    do {
      piVar6[lVar11] = piVar2[lVar11] - iVar4;
      lVar11 = lVar11 + 1;
    } while ((to_col - from_col) + 1 != (int)lVar11);
  }
  piVar6[iVar10] = (int)__new_size;
  lVar11 = (long)*piVar2;
  if (*piVar2 < piVar5[iVar1]) {
    piVar6 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar8[lVar11 - iVar4] = piVar6[lVar11];
      pdVar9[lVar11 - iVar4] = pdVar7[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 < piVar5[iVar1]);
  }
  this->num_col_ = iVar10;
  this->num_row_ = HVar3;
  this->format_ = kColwise;
  return;
}

Assistant:

void HighsSparseMatrix::createSlice(const HighsSparseMatrix& matrix,
                                    const HighsInt from_col,
                                    const HighsInt to_col) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  HighsInt num_row = matrix.num_row_;
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& slice_start = this->start_;
  vector<HighsInt>& slice_index = this->index_;
  vector<double>& slice_value = this->value_;
  HighsInt slice_num_col = to_col + 1 - from_col;
  HighsInt slice_num_nz = a_start[to_col + 1] - a_start[from_col];
  slice_start.resize(slice_num_col + 1);
  slice_index.resize(slice_num_nz);
  slice_value.resize(slice_num_nz);
  HighsInt from_col_start = a_start[from_col];
  for (HighsInt iCol = from_col; iCol < to_col + 1; iCol++)
    slice_start[iCol - from_col] = a_start[iCol] - from_col_start;
  slice_start[slice_num_col] = slice_num_nz;
  for (HighsInt iEl = a_start[from_col]; iEl < a_start[to_col + 1]; iEl++) {
    slice_index[iEl - from_col_start] = a_index[iEl];
    slice_value[iEl - from_col_start] = a_value[iEl];
  }
  this->num_col_ = slice_num_col;
  this->num_row_ = num_row;
  this->format_ = MatrixFormat::kColwise;
}